

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void map_put(Map *map,void *key,void *value)

{
  ListNode *pLVar1;
  List *pLVar2;
  List *pLVar3;
  Elem *data;
  void **ppvVar4;
  ulong uVar5;
  
  uVar5 = (ulong)key % (ulong)map->prime;
  ppvVar4 = map->elem;
  if (ppvVar4[uVar5] == (void *)0x0) {
    pLVar2 = new_list();
    map->elem[uVar5] = pLVar2;
    ppvVar4 = map->elem;
    uVar5 = (ulong)key % (ulong)map->prime;
  }
  pLVar2 = (List *)ppvVar4[uVar5];
  pLVar3 = pLVar2;
  do {
    pLVar1 = pLVar3->head;
    if (pLVar1 == (ListNode *)0x0) {
      data = new_elem(key,value);
      list_add(pLVar2,data);
      map->size = map->size + 1;
      return;
    }
    pLVar3 = (List *)&pLVar1->next;
  } while (*pLVar1->data != key);
  *(void **)((long)pLVar1->data + 8) = value;
  return;
}

Assistant:

void map_put(Map *map, void *key, void *value) {
    uint pos = hash_fun(key, map->prime);
    if (map->elem[pos] == NULL) {
        map->elem[pos] = new_list();
    }
    List *els = map_get_(map, key);
    Elem *elem;
    ListNode *node = els->head;
    while (node != NULL) {
        elem = node->data;
        if (hash(key) == hash(elem->key)) {
            elem->value = value;
            return;
        }
        node = node->next;
    }
    list_add(els, new_elem(key, value));
    map->size++;
}